

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

float __thiscall deqp::gls::DrawTest::getCoordScale(DrawTest *this,DrawTestSpec *spec)

{
  bool bVar1;
  InputType type;
  uint uVar2;
  pointer pAVar3;
  int arrayNdx;
  long lVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  GLValue GVar9;
  GLValue local_40;
  
  lVar5 = 0;
  fVar8 = 1.0;
  for (lVar4 = 0;
      pAVar3 = (spec->attribs).
               super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar4 < (int)(((long)(spec->attribs).
                           super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3) / 0x28);
      lVar4 = lVar4 + 1) {
    type = *(InputType *)((long)&pAVar3->inputType + lVar5);
    uVar2 = *(uint *)((long)&pAVar3->outputType + lVar5);
    bVar1 = (&pAVar3->normalize)[lVar5];
    if ((lVar5 == 0) || (((&pAVar3->additionalPositionAttribute)[lVar5] & 1U) != 0)) {
      if (type == INPUTTYPE_INT_2_10_10_10) {
        fVar7 = 1.0;
        if ((bVar1 & 1U) == 0) {
          fVar7 = 512.0;
        }
      }
      else if (type == INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
        fVar7 = 1.0;
        if ((bVar1 & 1U) == 0) {
          fVar7 = 1024.0;
        }
      }
      else {
        GVar9 = anon_unknown_1::GLValue::getMaxValue(type);
        local_40.field_1 = GVar9.field_1;
        local_40.type = GVar9.type;
        fVar6 = anon_unknown_1::GLValue::toFloat(&local_40);
        if (((bVar1 & 1U) == 0) ||
           ((fVar7 = 1.0, type < INPUTTYPE_UNSIGNED_INT_2_10_10_10 &&
            (fVar7 = 1.0, (0x207U >> (type & 0x1f) & 1) != 0)))) {
          fVar7 = fVar6 * 1.1 + 0.0;
        }
      }
      if ((uVar2 < 0xc) && ((0xd8cU >> (uVar2 & 0x1f) & 1) != 0)) {
        fVar7 = fVar7 + fVar7;
      }
      fVar8 = fVar8 + fVar7;
    }
    lVar5 = lVar5 + 0x28;
  }
  return 1.0 / fVar8;
}

Assistant:

float DrawTest::getCoordScale (const DrawTestSpec& spec) const
{
	float maxValue = 1.0f;

	for (int arrayNdx = 0; arrayNdx < (int)spec.attribs.size(); arrayNdx++)
	{
		DrawTestSpec::AttributeSpec attribSpec		= spec.attribs[arrayNdx];
		const bool					isPositionAttr	= (arrayNdx == 0) || (attribSpec.additionalPositionAttribute);
		float						attrMaxValue	= 0;

		if (!isPositionAttr)
			continue;

		if (attribSpec.inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10)
		{
			if (attribSpec.normalize)
				attrMaxValue += 1.0f;
			else
				attrMaxValue += 1024.0f;
		}
		else if (attribSpec.inputType == DrawTestSpec::INPUTTYPE_INT_2_10_10_10)
		{
			if (attribSpec.normalize)
				attrMaxValue += 1.0f;
			else
				attrMaxValue += 512.0f;
		}
		else
		{
			const float max = GLValue::getMaxValue(attribSpec.inputType).toFloat();

			attrMaxValue += (attribSpec.normalize && !inputTypeIsFloatType(attribSpec.inputType)) ? (1.0f) : (max * 1.1f);
		}

		if (attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_VEC3 || attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_VEC4
			|| attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_IVEC3 || attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_IVEC4
			|| attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_UVEC3 || attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_UVEC4)
				attrMaxValue *= 2;

		maxValue += attrMaxValue;
	}

	return 1.0f / maxValue;
}